

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_operators.h
# Opt level: O2

void __thiscall
Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
          (Zp_field_operators<unsigned_int,_void> *this,Element *e1,Element e2)

{
  Characteristic characteristic;
  Element EVar1;
  uint e1_00;
  
  e1_00 = *e1;
  characteristic = this->characteristic_;
  if (characteristic <= e1_00) {
    e1_00 = e1_00 % characteristic;
  }
  if (characteristic <= e2) {
    e2 = e2 % characteristic;
  }
  EVar1 = _multiply(e1_00,e2,characteristic);
  *e1 = EVar1;
  return;
}

Assistant:

void multiply_inplace(Element& e1, Element e2) const {
    e1 = _multiply(get_value(e1), get_value(e2), characteristic_);
  }